

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

void crnlib::rg_etc1::pack_etc1_block_init(void)

{
  int iVar1;
  uint uVar2;
  int i;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int color;
  ulong uVar15;
  bool bVar16;
  int aiStack_b8 [34];
  
  iVar3 = 0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      lVar8 = 0;
      do {
        iVar1 = (&g_etc1_inten_tables)[lVar6 * 4 + lVar8];
        uVar15 = 0;
        do {
          uVar12 = 0xffffffff;
          uVar5 = 0;
          uVar9 = 0;
          uVar13 = 0;
          uVar7 = 1;
          do {
            uVar10 = uVar7 - 1;
            if (lVar4 == 0) {
              uVar11 = uVar5 | uVar10;
            }
            else {
              uVar11 = uVar10 >> 2 | uVar9;
            }
            uVar11 = uVar11 + iVar1;
            if (0xfe < (int)uVar11) {
              uVar11 = 0xff;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            uVar14 = uVar11 - (int)uVar15;
            uVar2 = -uVar14;
            if (0 < (int)uVar14) {
              uVar2 = uVar14;
            }
            bVar16 = uVar2 < uVar12;
            if (bVar16) {
              uVar13 = uVar10;
              uVar12 = uVar2;
            }
            if (uVar15 == uVar11 && bVar16) break;
            uVar9 = uVar9 + 8;
            uVar5 = uVar5 + 0x10;
            bVar16 = uVar7 < (uint)(lVar4 != 0) * 0x10 + 0x10;
            uVar7 = uVar7 + 1;
          } while (bVar16);
          *(ushort *)
           (g_etc1_inverse_lookup + uVar15 * 2 + (lVar8 * 0x10 + lVar6 * 2 + lVar4) * 0x200) =
               (ushort)uVar13 | (ushort)(uVar12 << 8);
          uVar15 = uVar15 + 1;
        } while (uVar15 != 0x100);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    bVar16 = lVar4 != 0;
    lVar4 = lVar4 + 1;
    if (bVar16) {
      uVar15 = 0;
      do {
        aiStack_b8[uVar15] = ((uint)(uVar15 >> 2) & 0x3fffffff) + iVar3;
        uVar15 = uVar15 + 1;
        iVar3 = iVar3 + 8;
      } while (uVar15 != 0x20);
      lVar4 = 0;
      do {
        iVar3 = 0x107;
        if ((int)lVar4 < 0x107) {
          iVar3 = (int)lVar4;
        }
        if (iVar3 < 9) {
          iVar3 = 8;
        }
        (&g_quant5_tab)[lVar4] =
             (char)aiStack_b8[((iVar3 * 0x1f - 0x78U >> 8) + iVar3 * 0x1f) - 0x78 >> 8];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x110);
      return;
    }
  } while( true );
}

Assistant:

void pack_etc1_block_init()
        {
            for (uint diff = 0; diff < 2; diff++)
            {
                const uint limit = diff ? 32 : 16;

                for (uint inten = 0; inten < 8; inten++)
                {
                    for (uint selector = 0; selector < 4; selector++)
                    {
                        const uint inverse_table_index = diff + (inten << 1) + (selector << 4);
                        for (int color = 0; color < 256; color++)
                        {
                            uint best_error = cUINT32_MAX, best_packed_c = 0;
                            for (uint packed_c = 0; packed_c < limit; packed_c++)
                            {
                                int v = etc1_decode_value(diff, inten, selector, packed_c);
                                uint err = labs(v - color);
                                if (err < best_error)
                                {
                                    best_error = err;
                                    best_packed_c = packed_c;
                                    if (!best_error)
                                    {
                                        break;
                                    }
                                }
                            }
                            RG_ETC1_ASSERT(best_error <= 255);
                            g_etc1_inverse_lookup[inverse_table_index][color] = static_cast<uint16>(best_packed_c | (best_error << 8));
                        }
                    }
                }
            }

            uint expand5[32];
            for (int i = 0; i < 32; i++)
            {
                expand5[i] = (i << 3) | (i >> 2);
            }

            for (int i = 0; i < 256 + 16; i++)
            {
                int v = clamp<int>(i - 8, 0, 255);
                g_quant5_tab[i] = static_cast<uint8>(expand5[mul_8bit(v, 31)]);
            }
        }